

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O0

void __thiscall
de::AppendList<vk::DebugReportMessage>::append
          (AppendList<vk::DebugReportMessage> *this,DebugReportMessage *value)

{
  size_t sVar1;
  ulong uVar2;
  long lVar3;
  Block *this_00;
  Block *newBlock;
  size_t slotNdx;
  size_t blockNdx;
  size_t elementNdx;
  Block *curBlock;
  DebugReportMessage *value_local;
  AppendList<vk::DebugReportMessage> *this_local;
  
  elementNdx = (size_t)this->m_last;
  deMemoryReadWriteFence();
  sVar1 = deAtomicIncrementUSize(&this->m_numElements);
  uVar2 = (sVar1 - 1) / this->m_blockSize;
  lVar3 = (sVar1 - 1) - uVar2 * this->m_blockSize;
  while (*(ulong *)elementNdx != uVar2) {
    if (*(long *)(elementNdx + 0x10) == 0) {
      deYield();
    }
    else {
      elementNdx = *(size_t *)(elementNdx + 0x10);
    }
  }
  if (lVar3 + 1U == this->m_blockSize) {
    this_00 = (Block *)operator_new(0x18);
    Block::Block(this_00,uVar2 + 1,this->m_blockSize);
    deMemoryReadWriteFence();
    this->m_last = this_00;
    deMemoryReadWriteFence();
    *(Block **)(elementNdx + 0x10) = this_00;
    deMemoryReadWriteFence();
  }
  ::vk::DebugReportMessage::DebugReportMessage
            ((DebugReportMessage *)(*(long *)(elementNdx + 8) + lVar3 * 0x60),value);
  return;
}

Assistant:

void AppendList<ElementType>::append (const ElementType& value)
{
	// Fetch curBlock first before allocating slot. Otherwise m_last might get updated before
	// this thread gets chance of reading it, leading to curBlock->blockNdx > blockNdx.
	Block*			curBlock	= m_last;

	deMemoryReadWriteFence();

	{
		const size_t	elementNdx	= deAtomicIncrementUSize(&m_numElements) - 1;
		const size_t	blockNdx	= elementNdx / m_blockSize;
		const size_t	slotNdx		= elementNdx - (blockNdx * m_blockSize);

		while (curBlock->blockNdx != blockNdx)
		{
			if (curBlock->next)
				curBlock = curBlock->next;
			else
			{
				// Other thread(s) are currently allocating additional block(s)
				deYield();
			}
		}

		// Did we allocate last slot? If so, add a new block
		if (slotNdx+1 == m_blockSize)
		{
			Block* const	newBlock	= new Block(blockNdx+1, m_blockSize);

			deMemoryReadWriteFence();

			// At this point if any other thread is trying to allocate more blocks
			// they are being blocked by curBlock->next being null. This guarantees
			// that this thread has exclusive modify access to m_last.
			m_last = newBlock;
			deMemoryReadWriteFence();

			// At this point other threads might have skipped to newBlock, but we
			// still have exclusive modify access to curBlock->next.
			curBlock->next = newBlock;
			deMemoryReadWriteFence();
		}

		new (&curBlock->elements[slotNdx]) ElementType(value);
	}
}